

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratBig.cpp
# Opt level: O1

void __thiscall
primesieve::EratBig::storeSievingPrime
          (EratBig *this,uint64_t prime,uint64_t multipleIndex,uint64_t wheelIndex)

{
  byte bVar1;
  uint64_t uVar2;
  SievingPrime **ppSVar3;
  SievingPrime *pSVar4;
  SievingPrime **ppSVar5;
  SievingPrime **ppSVar6;
  long lVar7;
  ulong uVar8;
  
  bVar1 = (byte)this->log2SieveSize_;
  uVar8 = multipleIndex >> (bVar1 & 0x3f);
  uVar2 = this->moduloSieveSize_;
  ppSVar6 = (this->buckets_).end_;
  ppSVar5 = (this->buckets_).array_;
  while ((ulong)((long)ppSVar6 - (long)ppSVar5 >> 3) <
         (~(-1L << (bVar1 & 0x3f)) + (prime / 0x1e) * 10 + 10 >> (bVar1 & 0x3f)) + 1) {
    ppSVar3 = (this->buckets_).capacity_;
    if (ppSVar6 == ppSVar3) {
      lVar7 = (long)ppSVar3 - (long)ppSVar5 >> 2;
      Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
      reserve_unchecked(&this->buckets_,lVar7 + (ulong)(lVar7 == 0));
    }
    *(this->buckets_).end_ = (SievingPrime *)0x0;
    ppSVar5 = (this->buckets_).array_;
    ppSVar6 = (this->buckets_).end_ + 1;
    (this->buckets_).end_ = ppSVar6;
  }
  if (((ulong)ppSVar5[uVar8] & 0x1fff) == 0) {
    MemoryPool::addBucket(this->memoryPool_,ppSVar5 + uVar8);
  }
  ppSVar6 = (this->buckets_).array_;
  pSVar4 = ppSVar6[uVar8];
  ppSVar6[uVar8] = pSVar4 + 1;
  pSVar4->indexes_ = (int)wheelIndex << 0x17 | (uint)uVar2 & (uint)multipleIndex;
  pSVar4->sievingPrime_ = (uint32_t)(prime / 0x1e);
  return;
}

Assistant:

void EratBig::storeSievingPrime(uint64_t prime,
                                uint64_t multipleIndex,
                                uint64_t wheelIndex)
{
  uint64_t sieveSize = 1ull << log2SieveSize_;
  uint64_t sievingPrime = prime / 30;
  uint64_t maxNextMultiple = sievingPrime * getMaxFactor() + getMaxFactor();
  uint64_t maxMultipleIndex = sieveSize - 1 + maxNextMultiple;
  uint64_t maxSegmentIndex = maxMultipleIndex >> log2SieveSize_;
  uint64_t newSize = maxSegmentIndex + 1;
  uint64_t segment = multipleIndex >> log2SieveSize_;
  multipleIndex &= moduloSieveSize_;

  while (buckets_.size() < newSize)
    buckets_.push_back(nullptr);

  ASSERT(prime <= maxPrime_);
  ASSERT(segment < buckets_.size());

  if (Bucket::isFull(buckets_[segment]))
    memoryPool_->addBucket(buckets_[segment]);

  buckets_[segment]++->set(sievingPrime, multipleIndex, wheelIndex);
}